

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kDefectiveBase.cpp
# Opt level: O0

void __thiscall KDefectiveBase::~KDefectiveBase(KDefectiveBase *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  KDefectiveBase *this_local;
  
  this->_vptr_KDefectiveBase = (_func_int **)&PTR___cxa_pure_virtual_00157a50;
  pvVar1 = this->from;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    this_00 = pvVar1 + (long)pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
    while (pvVar1 != this_00) {
      this_00 = this_00 + -1;
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->dis != (int *)0x0) {
    operator_delete__(this->dis);
  }
  if (this->maxDis != (int *)0x0) {
    operator_delete__(this->maxDis);
  }
  if (this->isInPC != (bool *)0x0) {
    operator_delete__(this->isInPC);
  }
  if (this->neiSet != (void **)0x0) {
    operator_delete__(this->neiSet);
  }
  if (this->neiSet2 != (void **)0x0) {
    operator_delete__(this->neiSet2);
  }
  std::
  stack<KDefectiveBase::State,_std::deque<KDefectiveBase::State,_std::allocator<KDefectiveBase::State>_>_>
  ::~stack(&this->state);
  return;
}

Assistant:

KDefectiveBase::~KDefectiveBase() {
	delete[] from;
	delete[] dis;
    delete[] maxDis;
    delete[] isInPC;
	delete[] neiSet;
	delete[] neiSet2;
}